

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier.cpp
# Opt level: O1

string * __thiscall
license::hw_identifier::HwIdentifier::print_abi_cxx11_
          (string *__return_storage_ptr__,HwIdentifier *this)

{
  size_type sVar1;
  int in_R8D;
  string result;
  string local_30;
  
  base64_abi_cxx11_(&local_30,(license *)&this->m_data,(void *)0x8,5,in_R8D);
  if (local_30._M_string_length != 0) {
    sVar1 = 0;
    do {
      if (local_30._M_dataplus._M_p[sVar1] == '\n') {
        local_30._M_dataplus._M_p[sVar1] = '-';
      }
      sVar1 = sVar1 + 1;
    } while (local_30._M_string_length != sVar1);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HwIdentifier::print() const {
	string result = base64(m_data.data(), m_data.size(), 5);
	std::replace(result.begin(), result.end(), '\n', '-');
	return result.substr(0, result.size() - 1);
}